

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_Writer::Write_Permute_(OSTEI_Writer *this,QAM *am,bool swap12,bool swap34)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  QAM *pQVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  char vd;
  char vc;
  char vb;
  char va;
  allocator local_1f9;
  size_t ncart_abcd;
  undefined4 local_1ec;
  undefined1 local_1e8 [48];
  string local_1b8;
  string idx;
  string local_178;
  size_t ncart_cd;
  size_t ncart_bcd;
  size_t ncart_d;
  string fname;
  undefined1 local_120 [48];
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  QAM::QAM((QAM *)local_1e8,am);
  uVar5 = local_1e8._12_4_;
  uVar4 = local_1e8._8_4_;
  if ((int)CONCAT71(in_register_00000011,swap12) == 0) {
    if (swap34) goto LAB_0012051a;
  }
  else {
    iVar13 = (int)local_1e8._0_8_;
    iVar14 = SUB84(local_1e8._0_8_,4);
    local_1e8._4_4_ = iVar13;
    local_1e8._0_4_ = iVar14;
    if (swap34) {
LAB_0012051a:
      local_1e8._8_4_ = local_1e8._12_4_;
      local_1e8._12_4_ = uVar4;
      if (uVar5 == uVar4 && !swap12) goto LAB_00120fea;
      if (swap12) {
        if (uVar5 == uVar4 || local_1e8._0_4_ == local_1e8._4_4_) goto LAB_00120fea;
      }
    }
    else if ((swap12) && (iVar14 == iVar13)) goto LAB_00120fea;
  }
  poVar8 = (this->super_OSTEI_Writer_Base).os_;
  pQVar10 = (QAM *)local_1e8;
  QAM::QAM((QAM *)local_90,pQVar10);
  FunctionPrototype__abi_cxx11_(&fname,(OSTEI_Writer *)pQVar10,(QAM *)local_90);
  poVar8 = std::operator<<(poVar8,(string *)&fname);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"{\n");
  if (swap12) {
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"double P_AB[3*P.nshell12];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"struct simint_multi_shellpair P_tmp = P;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.AB_x = P_AB;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.AB_y = P_AB + P.nshell12;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.AB_z = P_AB + 2*P.nshell12;\n");
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"for(int i = 0; i < P.nshell12; i++)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.AB_x[i] = -P.AB_x[i];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.AB_y[i] = -P.AB_y[i];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"P_tmp.AB_z[i] = -P.AB_z[i];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"}\n\n");
    pcVar11 = "P_tmp";
  }
  else {
    pcVar11 = "P";
  }
  if (swap34) {
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"double Q_AB[3*Q.nshell12];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"struct simint_multi_shellpair Q_tmp = Q;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.AB_x = Q_AB;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.AB_y = Q_AB + Q.nshell12;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n");
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"for(int i = 0; i < Q.nshell12; i++)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.AB_x[i] = -Q.AB_x[i];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.AB_y[i] = -Q.AB_y[i];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"Q_tmp.AB_z[i] = -Q.AB_z[i];\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"}\n\n");
    pcVar12 = "Q_tmp";
  }
  else {
    pcVar12 = "Q";
  }
  pQVar10 = am;
  QAM::QAM((QAM *)local_c0,am);
  FunctionName__abi_cxx11_(&fname,(OSTEI_Writer *)pQVar10,(QAM *)local_c0);
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"int ret = ");
  poVar8 = std::operator<<(poVar8,(string *)&fname);
  poVar8 = std::operator<<(poVar8,"(");
  poVar8 = std::operator<<(poVar8,pcVar11);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = std::operator<<(poVar8,pcVar12);
  poVar8 = std::operator<<(poVar8,", screen_tol, ");
  poVar8 = std::operator<<(poVar8,"work, ");
  std::__cxx11::string::string((string *)&local_1b8,"",(allocator *)&local_178);
  ArrVarName(&idx,(QAM *)local_1e8,&local_1b8);
  poVar8 = std::operator<<(poVar8,(string *)&idx);
  std::operator<<(poVar8,");\n");
  std::__cxx11::string::~string((string *)&idx);
  std::__cxx11::string::~string((string *)&local_1b8);
  pQVar10 = (QAM *)local_60;
  QAM::QAM(pQVar10,(QAM *)local_1e8);
  local_1ec = (undefined4)CONCAT71(in_register_00000009,swap34);
  bVar6 = IsSpecialPermutation_((OSTEI_Writer *)pQVar10,(QAM *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  if (!bVar6) {
    QAM::QAM((QAM *)local_f0,am);
    iVar7 = NCART((QAM *)local_f0);
    std::__cxx11::string::~string((string *)(local_f0 + 0x10));
    iVar13 = (am->qam)._M_elems[1];
    iVar14 = (am->qam)._M_elems[2];
    uVar9 = 0;
    uVar1 = (uint)((iVar13 + 1) * (iVar13 + 2)) >> 1;
    if (iVar13 < 0) {
      uVar1 = uVar9;
    }
    uVar2 = (uint)((iVar14 + 1) * (iVar14 + 2)) >> 1;
    if (iVar14 < 0) {
      uVar2 = uVar9;
    }
    iVar13 = (am->qam)._M_elems[3];
    uVar3 = (uint)((iVar13 + 1) * (iVar13 + 2)) >> 1;
    if (iVar13 < 0) {
      uVar3 = uVar9;
    }
    ncart_d = (size_t)uVar3;
    ncart_cd = uVar2 * ncart_d;
    ncart_bcd = uVar1 * ncart_cd;
    va = 'a';
    vb = 'b';
    vc = 'c';
    vd = 'd';
    if (swap12) {
      va = 'b';
      vb = 'a';
    }
    if ((char)local_1ec != '\0') {
      vc = 'd';
      vd = 'c';
    }
    ncart_abcd = (long)iVar7;
    StringBuilder<char[3],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
              (&idx,(char (*) [3])0x13c507,&ncart_abcd,(char (*) [2])"+",&va,(char (*) [2])0x13caa2,
               &ncart_bcd,(char (*) [2])"+",&vb,(char (*) [2])0x13caa2,&ncart_cd,(char (*) [2])"+",
               &vc,(char (*) [2])0x13caa2,&ncart_d,(char (*) [2])"+",&vd);
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"double buffer[");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"] SIMINT_ALIGN_ARRAY_DBL;\n\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"for(int q = 0; q < ret; q++)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar8,"int idx = 0;\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"for(int a = 0; a < ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"; ++a)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"for(int b = 0; b < ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"; ++b)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"for(int c = 0; c < ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"; ++c)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"for(int d = 0; d < ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"; ++d)\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent3_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"buffer[idx++] = ");
    std::__cxx11::string::string((string *)&local_178,"",&local_1f9);
    ArrVarName(&local_1b8,(QAM *)local_1e8,&local_178);
    poVar8 = std::operator<<(poVar8,(string *)&local_1b8);
    poVar8 = std::operator<<(poVar8,"[");
    poVar8 = std::operator<<(poVar8,(string *)&idx);
    std::operator<<(poVar8,"];\n");
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_178);
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"memcpy(");
    std::__cxx11::string::string((string *)&local_178,"",&local_1f9);
    ArrVarName(&local_1b8,(QAM *)local_1e8,&local_178);
    poVar8 = std::operator<<(poVar8,(string *)&local_1b8);
    poVar8 = std::operator<<(poVar8,"+q*");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,", buffer, ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"*sizeof(double));\n");
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_178);
    poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar8,"}\n");
    std::__cxx11::string::~string((string *)&idx);
  }
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  poVar8 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar8,"return ret;\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"}\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  poVar8 = (this->super_OSTEI_Writer_Base).osh_;
  pQVar10 = (QAM *)local_1e8;
  QAM::QAM((QAM *)local_120,pQVar10);
  FunctionPrototype__abi_cxx11_(&idx,(OSTEI_Writer *)pQVar10,(QAM *)local_120);
  poVar8 = std::operator<<(poVar8,(string *)&idx);
  std::operator<<(poVar8,";\n\n");
  std::__cxx11::string::~string((string *)&idx);
  std::__cxx11::string::~string((string *)(local_120 + 0x10));
  std::__cxx11::string::~string((string *)&fname);
LAB_00120fea:
  std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
  return;
}

Assistant:

void OSTEI_Writer::Write_Permute_(QAM am, bool swap12, bool swap34) const
{
    QAM permuted = am;
    if(swap12)
        std::swap(permuted[0], permuted[1]);
    if(swap34)
        std::swap(permuted[2], permuted[3]);

    // is this permutation unique?
    if(swap34 && !swap12 && permuted[2] == permuted[3])
        return;
    if(swap12 && !swap34 && permuted[0] == permuted[1])
        return;
    if(swap12 && swap34 && (permuted[0] == permuted[1] || permuted[2] == permuted[3]))
        return;

    // output of the function starts here
    os_ << FunctionPrototype_(permuted) << "\n";
    os_ << "{\n";

    const char * P_var = "P";
    const char * Q_var = "Q";

    if(swap12)
    {
        P_var = "P_tmp";
        os_ << indent1 << "double P_AB[3*P.nshell12];\n";
        os_ << indent1 << "struct simint_multi_shellpair P_tmp = P;\n";
        os_ << indent1 << "P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n";
        os_ << indent1 << "P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n";
        os_ << indent1 << "P_tmp.AB_x = P_AB;\n";
        os_ << indent1 << "P_tmp.AB_y = P_AB + P.nshell12;\n";
        os_ << indent1 << "P_tmp.AB_z = P_AB + 2*P.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < P.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "P_tmp.AB_x[i] = -P.AB_x[i];\n";
        os_ << indent2 << "P_tmp.AB_y[i] = -P.AB_y[i];\n";
        os_ << indent2 << "P_tmp.AB_z[i] = -P.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    if(swap34)
    {
        Q_var = "Q_tmp";
        os_ << indent1 << "double Q_AB[3*Q.nshell12];\n";
        os_ << indent1 << "struct simint_multi_shellpair Q_tmp = Q;\n";
        os_ << indent1 << "Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n";
        os_ << indent1 << "Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n";
        os_ << indent1 << "Q_tmp.AB_x = Q_AB;\n";
        os_ << indent1 << "Q_tmp.AB_y = Q_AB + Q.nshell12;\n";
        os_ << indent1 << "Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < Q.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "Q_tmp.AB_x[i] = -Q.AB_x[i];\n";
        os_ << indent2 << "Q_tmp.AB_y[i] = -Q.AB_y[i];\n";
        os_ << indent2 << "Q_tmp.AB_z[i] = -Q.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    std::string fname = FunctionName_(am);
    os_ << indent1 << "int ret = " << fname
        << "(" << P_var << ", " << Q_var << ", screen_tol, "
        << "work, " << ArrVarName(permuted) << ");\n";


    if(!IsSpecialPermutation_(permuted))
    {
        size_t ncart_abcd = NCART(am);
        //size_t ncart_a  = NCART(am[0]);
        size_t ncart_b  = NCART(am[1]);
        size_t ncart_c  = NCART(am[2]);
        size_t ncart_d  = NCART(am[3]);
        size_t ncart_a2 = NCART(permuted[0]);
        size_t ncart_b2 = NCART(permuted[1]);
        size_t ncart_c2 = NCART(permuted[2]);
        size_t ncart_d2 = NCART(permuted[3]);

        size_t ncart_bcd = ncart_b * ncart_c * ncart_d;
        size_t ncart_cd = ncart_c * ncart_d;

        char va = 'a';
        char vb = 'b';
        char vc = 'c';
        char vd = 'd';

        if(swap12)
            std::swap(va, vb);
        if(swap34)
            std::swap(vc, vd);

        std::string idx = StringBuilder("q*", ncart_abcd,
                                        "+", va, "*", ncart_bcd,
                                        "+", vb, "*", ncart_cd,
                                        "+", vc, "*", ncart_d, "+", vd);

        os_ << indent1 << "double buffer[" << ncart_abcd << "] SIMINT_ALIGN_ARRAY_DBL;\n\n";


        os_ << indent1 << "for(int q = 0; q < ret; q++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "int idx = 0;\n";
        os_ << indent2 << "for(int a = 0; a < " << ncart_a2 << "; ++a)\n";
        os_ << indent2 << "for(int b = 0; b < " << ncart_b2 << "; ++b)\n";
        os_ << indent2 << "for(int c = 0; c < " << ncart_c2 << "; ++c)\n";
        os_ << indent2 << "for(int d = 0; d < " << ncart_d2 << "; ++d)\n";
        os_ << indent3 << "buffer[idx++] = " << ArrVarName(permuted) << "[" << idx << "];\n";
        os_ << "\n";
        os_ << indent2 << "memcpy(" << ArrVarName(permuted) << "+q*" << ncart_abcd
                       << ", buffer, " << ncart_abcd << "*sizeof(double));\n";
        os_ << indent1 << "}\n";
    }

    os_ << "\n";
    os_ << indent1 << "return ret;\n";
    os_ << "}\n";
    os_ << "\n";

    osh_ << FunctionPrototype_(permuted) << ";\n\n";
}